

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TopicTree.h
# Opt level: O2

void __thiscall uWS::TopicTree::unsubscribeAll(TopicTree *this,Subscriber *subscriber)

{
  Topic *topic;
  Subscriber *pSVar1;
  list<uWS::Topic_*,_std::allocator<uWS::Topic_*>_> *local_30;
  
  if (subscriber != (Subscriber *)0x0) {
    pSVar1 = subscriber;
    local_30 = (list<uWS::Topic_*,_std::allocator<uWS::Topic_*>_> *)subscriber;
    while (pSVar1 = *(Subscriber **)pSVar1, pSVar1 != subscriber) {
      topic = *(Topic **)(pSVar1 + 0x10);
      std::
      _Rb_tree<uWS::Subscriber_*,_uWS::Subscriber_*,_std::_Identity<uWS::Subscriber_*>,_std::less<uWS::Subscriber_*>,_std::allocator<uWS::Subscriber_*>_>
      ::erase(&(topic->subs)._M_t,(key_type *)&local_30);
      trimTree(this,topic);
    }
    std::__cxx11::list<uWS::Topic_*,_std::allocator<uWS::Topic_*>_>::clear(local_30);
  }
  return;
}

Assistant:

void unsubscribeAll(Subscriber *subscriber) {
        if (subscriber) {
            for (Topic *topic : subscriber->subscriptions) {
                topic->subs.erase(subscriber);
                trimTree(topic);
            }
            subscriber->subscriptions.clear();
        }
    }